

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::getintervals(void)

{
  mapped_type mVar1;
  int iVar2;
  mapped_type *pmVar3;
  float fVar4;
  float pos;
  interval idx;
  size_t i;
  FILE *pFStack_10;
  float q;
  FILE *fin;
  
  pFStack_10 = fopen("input/quantile.bin","rb");
  if (pFStack_10 == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: Error opening file %s\n","getintervals","input/quantile.bin");
    exit(1);
  }
  idx = (interval)fread((void *)((long)&i + 4),4,1,pFStack_10);
  while (idx != (interval)0x0) {
    fVar4 = (float)(samplesize_ + -1) * i._4_4_ + 1.0;
    iVar2 = (int)fVar4;
    pmVar3 = std::
             map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
             ::operator[]((map<float,_interval,_std::less<float>,_std::allocator<std::pair<const_float,_interval>_>_>
                           *)intervals_,(key_type_conflict *)((long)&i + 4));
    mVar1.fractional_part = fVar4 - (float)iVar2;
    mVar1.integer_part = iVar2;
    *pmVar3 = mVar1;
    idx = (interval)fread((void *)((long)&i + 4),4,1,pFStack_10);
  }
  fclose(pFStack_10);
  return;
}

Assistant:

void getintervals()
	{

		FILE * fin = fopen(QUANTILE_FILE, "rb");
		if (fin == NULL) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, QUANTILE_FILE);
			exit(EXIT_FAILURE);
		}

		float q;
		size_t i = fread(&q, sizeof(q), 1, fin);
		while (i != 0) {
			interval idx;
			float pos = (samplesize_ - 1) * q + 1;
			idx.integer_part = (int)pos;
			idx.fractional_part = pos - idx.integer_part;
			intervals_[q] = idx;
			i = fread(&q, sizeof(q), 1, fin);
		}

		fclose(fin);

	}